

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

shared_ptr<pbrt::syntactic::Scene> pbrt::syntactic::Scene::parse(string *fileName,string *basePath)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pbrt::syntactic::Scene> sVar1;
  shared_ptr<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>_> parser;
  _Alloc_hider local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  make_shared<pbrt::syntactic::BasicParser<pbrt::syntactic::MappedFile>,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  BasicParser<pbrt::syntactic::MappedFile>::parse
            ((BasicParser<pbrt::syntactic::MappedFile> *)local_28._M_p,basePath);
  std::__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> *)fileName,
             (__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> *)
             (local_28._M_p + 0x278));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  sVar1.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fileName;
  return (shared_ptr<pbrt::syntactic::Scene>)
         sVar1.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Scene> Scene::parse(const std::string &fileName, const std::string &basePath)
    {
      std::shared_ptr<Parser> parser = std::make_shared<Parser>(basePath);
      parser->parse(fileName);
      return parser->getScene();
    }